

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_unpack(lua_State *L)

{
  cTValue *pcVar1;
  long lVar2;
  bool bVar3;
  MSize MVar4;
  int iVar5;
  GCtab *t_00;
  cTValue *pcVar6;
  long in_RDI;
  cTValue *tv;
  int32_t e;
  int32_t i;
  int32_t n;
  GCtab *t;
  undefined8 in_stack_ffffffffffffffa8;
  ErrMsg em;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  lua_State *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  MSize MVar7;
  uint local_38;
  int local_1c;
  
  em = (ErrMsg)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  t_00 = lj_lib_checktab((lua_State *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         em);
  local_38 = lj_lib_optint((lua_State *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                           (int32_t)in_stack_ffffffffffffffb8);
  if ((*(long *)(in_RDI + 0x10) + 0x10U < *(ulong *)(in_RDI + 0x18)) &&
     (*(int *)(*(long *)(in_RDI + 0x10) + 0x14) != -1)) {
    MVar4 = lj_lib_checkint(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  }
  else {
    MVar4 = lj_tab_len((GCtab *)in_stack_ffffffffffffffb8);
  }
  if ((int)MVar4 < (int)local_38) {
    local_1c = 0;
  }
  else {
    local_1c = (MVar4 - local_38) + 1;
    if ((local_1c < 1) ||
       (MVar7 = MVar4,
       iVar5 = lua_checkstack((lua_State *)CONCAT44(MVar4,in_stack_ffffffffffffffb0),em), iVar5 == 0
       )) {
      lj_err_caller((lua_State *)CONCAT44(MVar4,in_stack_ffffffffffffffb0),em);
    }
    do {
      if (local_38 < t_00->asize) {
        pcVar6 = (cTValue *)((ulong)(t_00->array).ptr32 + (long)(int)local_38 * 8);
      }
      else {
        pcVar6 = lj_tab_getinth(t_00,local_38);
      }
      if (pcVar6 == (cTValue *)0x0) {
        lVar2 = *(long *)(in_RDI + 0x18);
        *(long *)(in_RDI + 0x18) = lVar2 + 8;
        *(undefined4 *)(lVar2 + 4) = 0xffffffff;
      }
      else {
        pcVar1 = *(cTValue **)(in_RDI + 0x18);
        *(cTValue **)(in_RDI + 0x18) = pcVar1 + 1;
        *pcVar1 = *pcVar6;
      }
      bVar3 = (int)local_38 < (int)MVar7;
      local_38 = local_38 + 1;
    } while (bVar3);
  }
  return local_1c;
}

Assistant:

LJLIB_CF(unpack)
{
  GCtab *t = lj_lib_checktab(L, 1);
  int32_t n, i = lj_lib_optint(L, 2, 1);
  int32_t e = (L->base+3-1 < L->top && !tvisnil(L->base+3-1)) ?
	      lj_lib_checkint(L, 3) : (int32_t)lj_tab_len(t);
  if (i > e) return 0;
  n = e - i + 1;
  if (n <= 0 || !lua_checkstack(L, n))
    lj_err_caller(L, LJ_ERR_UNPACK);
  do {
    cTValue *tv = lj_tab_getint(t, i);
    if (tv) {
      copyTV(L, L->top++, tv);
    } else {
      setnilV(L->top++);
    }
  } while (i++ < e);
  return n;
}